

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O0

void __thiscall deqp::egl::ApiCase::deinit(ApiCase *this)

{
  Library *pLVar1;
  Library *egl;
  ApiCase *this_local;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_display);
  this->m_display = (EGLDisplay)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_supportedClientAPIs);
  return;
}

Assistant:

void ApiCase::deinit (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	egl.terminate(m_display);

	m_display = EGL_NO_DISPLAY;
	m_supportedClientAPIs.clear();
}